

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcol.c
# Opt level: O0

int ffgpf(fitsfile *fptr,int datatype,LONGLONG firstelem,LONGLONG nelem,void *array,char *nullarray,
         int *anynul,int *status)

{
  long in_RCX;
  int in_ESI;
  double *unaff_retaddr;
  ULONGLONG *in_stack_00000008;
  int *in_stack_00000040;
  int *in_stack_00000048;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar1;
  
  if ((*(int *)nullarray < 1) && (in_RCX != 0)) {
    if (in_ESI == 0xb) {
      ffgpfb((fitsfile *)firstelem,nelem,(LONGLONG)array,(LONGLONG)nullarray,
             (uchar *)in_stack_00000008,(char *)unaff_retaddr,anynul,status);
    }
    else if (in_ESI == 0xc) {
      ffgpfsb((fitsfile *)firstelem,nelem,(LONGLONG)array,(LONGLONG)nullarray,
              (char *)in_stack_00000008,(char *)unaff_retaddr,anynul,status);
    }
    else if (in_ESI == 0x14) {
      ffgpfui((fitsfile *)firstelem,nelem,(LONGLONG)array,(LONGLONG)nullarray,
              (unsigned_short *)in_stack_00000008,(char *)unaff_retaddr,anynul,status);
    }
    else if (in_ESI == 0x15) {
      ffgpfi((fitsfile *)firstelem,nelem,(LONGLONG)array,(LONGLONG)nullarray,
             (short *)in_stack_00000008,(char *)unaff_retaddr,anynul,status);
    }
    else if (in_ESI == 0x1e) {
      ffgpfuk((fitsfile *)firstelem,nelem,(LONGLONG)array,(LONGLONG)nullarray,
              (uint *)in_stack_00000008,(char *)unaff_retaddr,anynul,status);
    }
    else if (in_ESI == 0x1f) {
      ffgpfk((fitsfile *)firstelem,nelem,(LONGLONG)array,(LONGLONG)nullarray,
             (int *)in_stack_00000008,(char *)unaff_retaddr,anynul,status);
    }
    else if (in_ESI == 0x28) {
      ffgpfuj((fitsfile *)nelem,(long)array,(LONGLONG)nullarray,(LONGLONG)in_stack_00000008,
              (unsigned_long *)unaff_retaddr,
              (char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),anynul,status);
    }
    else if (in_ESI == 0x29) {
      ffgpfj((fitsfile *)nelem,(long)array,(LONGLONG)nullarray,(LONGLONG)in_stack_00000008,
             (long *)unaff_retaddr,
             (char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),anynul,status);
    }
    else if (in_ESI == 0x50) {
      ffgpfujj((fitsfile *)firstelem,nelem,(LONGLONG)array,(LONGLONG)nullarray,in_stack_00000008,
               (char *)unaff_retaddr,anynul,status);
    }
    else if (in_ESI == 0x51) {
      ffgpfjj((fitsfile *)firstelem,nelem,(LONGLONG)array,(LONGLONG)nullarray,
              (LONGLONG *)in_stack_00000008,(char *)unaff_retaddr,anynul,status);
    }
    else if (in_ESI == 0x2a) {
      ffgpfe((fitsfile *)nelem,(long)array,(LONGLONG)nullarray,(LONGLONG)in_stack_00000008,
             (float *)unaff_retaddr,
             (char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_stack_00000040
             ,in_stack_00000048);
    }
    else if (in_ESI == 0x52) {
      ffgpfd((fitsfile *)nelem,(long)array,(LONGLONG)nullarray,(LONGLONG)in_stack_00000008,
             unaff_retaddr,(char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
             in_stack_00000040,in_stack_00000048);
    }
    else {
      nullarray[0] = -0x66;
      nullarray[1] = '\x01';
      nullarray[2] = '\0';
      nullarray[3] = '\0';
    }
    iVar1 = *(int *)nullarray;
  }
  else {
    iVar1 = *(int *)nullarray;
  }
  return iVar1;
}

Assistant:

int ffgpf(  fitsfile *fptr,   /* I - FITS file pointer                       */
            int  datatype,    /* I - datatype of the value                   */
            LONGLONG firstelem,   /* I - first vector element to read (1 = 1st)  */
            LONGLONG nelem,       /* I - number of values to read                */
            void *array,      /* O - array of values that are returned       */
            char *nullarray,  /* O - array of null value flags               */
            int  *anynul,     /* O - set to 1 if any values are null; else 0 */
            int  *status)     /* IO - error status                           */
/*
  Read an array of values from the primary array. The datatype of the
  input array is defined by the 2nd argument.  Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of
  the FITS array is not the same as the array being read).
  The nullarray values will = 1 if the corresponding array value is null.
  ANYNUL is returned with a value of .true. if any pixels are undefined.
*/
{

    if (*status > 0 || nelem == 0)   /* inherit input status value if > 0 */
        return(*status);

    /*
      the primary array is represented as a binary table:
      each group of the primary array is a row in the table,
      where the first column contains the group parameters
      and the second column contains the image itself.
    */

    if (datatype == TBYTE)
    {
        ffgpfb(fptr, 1, firstelem, nelem, 
               (unsigned char *) array, nullarray, anynul, status);
    }
    else if (datatype == TSBYTE)
    {
        ffgpfsb(fptr, 1, firstelem, nelem, 
               (signed char *) array, nullarray, anynul, status);
    }
    else if (datatype == TUSHORT)
    {
        ffgpfui(fptr, 1, firstelem, nelem, 
               (unsigned short *) array, nullarray, anynul, status);
    }
    else if (datatype == TSHORT)
    {
        ffgpfi(fptr, 1, firstelem, nelem, 
               (short *) array, nullarray, anynul, status);
    }
    else if (datatype == TUINT)
    {
        ffgpfuk(fptr, 1, firstelem, nelem, 
               (unsigned int *) array, nullarray, anynul, status);
    }
    else if (datatype == TINT)
    {
        ffgpfk(fptr, 1, firstelem, nelem, 
               (int *) array, nullarray, anynul, status);
    }
    else if (datatype == TULONG)
    {
        ffgpfuj(fptr, 1, firstelem, nelem, 
               (unsigned long *) array, nullarray, anynul, status);
    }
    else if (datatype == TLONG)
    {
        ffgpfj(fptr, 1, firstelem, nelem,
               (long *) array, nullarray, anynul, status);
    }
    else if (datatype == TULONGLONG)
    {
        ffgpfujj(fptr, 1, firstelem, nelem,
               (ULONGLONG *) array, nullarray, anynul, status);
    }
    else if (datatype == TLONGLONG)
    {
        ffgpfjj(fptr, 1, firstelem, nelem,
               (LONGLONG *) array, nullarray, anynul, status);
    }
    else if (datatype == TFLOAT)
    {
        ffgpfe(fptr, 1, firstelem, nelem, 
               (float *) array, nullarray, anynul, status);
    }
    else if (datatype == TDOUBLE)
    {
        ffgpfd(fptr, 1, firstelem, nelem,
               (double *) array, nullarray, anynul, status);
    }
    else
      *status = BAD_DATATYPE;

    return(*status);
}